

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

void __thiscall QDirPrivate::clearCache(QDirPrivate *this,MetaDataClearing mode)

{
  QAbstractFileEngine *pQVar1;
  QAbstractFileEngine *pQVar2;
  long in_FS_OFFSET;
  QAbstractFileEngine *local_20;
  char16_t *local_18;
  
  local_18 = *(char16_t **)(in_FS_OFFSET + 0x28);
  if (mode == IncludingMetaData) {
    (this->fileCache).metaData.knownFlagsMask.
    super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = 0;
  }
  LOCK();
  (this->fileCache).fileListsInitialized._M_base._M_i = false;
  UNLOCK();
  QList<QString>::clear(&(this->fileCache).files);
  QList<QFileInfo>::clear(&(this->fileCache).fileInfos);
  QFileSystemEngine::createLegacyEngine
            ((QFileSystemEntry *)&stack0xffffffffffffffe0,(QFileSystemMetaData *)&this->dirEntry);
  pQVar2 = local_20;
  local_20 = (QAbstractFileEngine *)0x0;
  pQVar1 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  (this->fileEngine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = pQVar2;
  if (pQVar1 != (QAbstractFileEngine *)0x0) {
    (*pQVar1->_vptr_QAbstractFileEngine[1])();
    if (local_20 != (QAbstractFileEngine *)0x0) {
      (**(code **)(*(long *)&((Data *)local_20)->super_QArrayData + 8))();
    }
  }
  if (*(char16_t **)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QDirPrivate::clearCache(MetaDataClearing mode)
{
    QMutexLocker locker(&fileCache.mutex);
    if (mode == IncludingMetaData)
        fileCache.metaData.clear();
    fileCache.fileListsInitialized = false;
    fileCache.files.clear();
    fileCache.fileInfos.clear();
    fileEngine = QFileSystemEngine::createLegacyEngine(dirEntry, fileCache.metaData);
}